

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O2

void __thiscall SemanticTypes::visit(SemanticTypes *this,PointerValNode *pointerValNode)

{
  uint uVar1;
  ExpNode *pEVar2;
  int iVar3;
  char *__format;
  
  pEVar2 = pointerValNode->exp;
  if (pEVar2 == (ExpNode *)0x0) {
    uVar1 = (pointerValNode->super_ExpNode).super_StmtNode.super_ASTNode.line;
    __format = "[SEMANTIC ERROR - pointerValNode] INVALID VALUE EXPRESSION, line %d\n";
  }
  else {
    (*(pEVar2->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar2,this);
    pEVar2 = pointerValNode->exp;
    if (pEVar2->pointer != false) {
      (pointerValNode->super_ExpNode).typeLexeme = pEVar2->typeLexeme;
      (pointerValNode->super_ExpNode).lValue = true;
      iVar3 = pEVar2->arraySize;
      (pointerValNode->super_ExpNode).type = pEVar2->type;
      (pointerValNode->super_ExpNode).arraySize = iVar3;
      (pointerValNode->super_ExpNode).pointer = false;
      return;
    }
    uVar1 = (pointerValNode->super_ExpNode).super_StmtNode.super_ASTNode.line;
    __format = 
    "[SEMANTIC ERROR - pointerValNode] CANNOT ACCESS VALUE OF A NON POINTER TYPE, line %d\n";
  }
  fprintf(_stderr,__format,(ulong)uVar1);
  return;
}

Assistant:

void SemanticTypes::visit(PointerValNode *pointerValNode) {

    if (pointerValNode->getExp()) {
        pointerValNode->getExp()->accept(this);
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - pointerValNode] INVALID VALUE EXPRESSION, line %d\n",
                pointerValNode->getLine());
        return;
    }

    if (!pointerValNode->getExp()->isPointer()) {
        fprintf(stderr, "[SEMANTIC ERROR - pointerValNode] CANNOT ACCESS VALUE OF A NON POINTER TYPE, line %d\n",
                pointerValNode->getLine());
        return;
    }

    pointerValNode->setType(pointerValNode->getExp()->getType());
    pointerValNode->setTypeLexeme(pointerValNode->getExp()->getTypeLexeme());
    pointerValNode->setLValue(true);
    pointerValNode->setArraySize(pointerValNode->getExp()->getArraySize());
    pointerValNode->setPointer(false);

}